

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

int lua_checkstack(lua_State *L,int size)

{
  int iVar1;
  
  iVar1 = 0;
  if ((size < 0x1f41) && ((long)size + ((long)L->top - (long)L->base >> 3) < 0x1f41)) {
    iVar1 = 1;
    if ((0 < size) &&
       ((long)((ulong)(L->maxstack).ptr32 - (long)L->top) <= (long)((ulong)(uint)size * 8))) {
      lj_state_growstack(L,size);
    }
  }
  return iVar1;
}

Assistant:

LUA_API int lua_checkstack(lua_State *L, int size)
{
  if (size > LUAI_MAXCSTACK || (L->top - L->base + size) > LUAI_MAXCSTACK) {
    return 0;  /* Stack overflow. */
  } else if (size > 0) {
    lj_state_checkstack(L, (MSize)size);
  }
  return 1;
}